

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O3

void __thiscall cppnet::PoolAlloter::Free(PoolAlloter *this,void **data,uint32_t len)

{
  MemNode *pMVar1;
  element_type *peVar2;
  pointer ppMVar3;
  uint uVar4;
  
  pMVar1 = (MemNode *)*data;
  if (pMVar1 != (MemNode *)0x0) {
    if (len < 0x101) {
      uVar4 = (len + 7 >> 3) - 1;
      ppMVar3 = (this->_free_list).
                super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *pMVar1 = *(MemNode *)(ppMVar3 + uVar4);
      ppMVar3[uVar4] = pMVar1;
    }
    else {
      peVar2 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar2->_vptr_Alloter[5])(peVar2,data,0);
    }
    *data = (void *)0x0;
  }
  return;
}

Assistant:

void PoolAlloter::Free(void* &data, uint32_t len) {
    if (!data) {
        return;
    }
    
    if (len > __default_max_bytes) {
        _alloter->Free(data);
        data = nullptr;
        return;
    }

#ifdef __use_iocp__
    std::lock_guard<std::mutex> lock(_mutex);
#endif
    MemNode* node = (MemNode*)data;
    MemNode** my_free = &(_free_list[FreeListIndex(len)]);
    
    node->_next = *my_free;
    *my_free = node;
    data = nullptr;
}